

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
ParserTOICompactRewardDecPOMDPDiscrete::StoreDecPOMDP
          (ParserTOICompactRewardDecPOMDPDiscrete *this,DecPOMDPDiscrete *decpomdp,Index id)

{
  DecPOMDPDiscrete::ExtractMADPDiscrete
            (decpomdp,(this->_m_problem->super_TOIDecPOMDPDiscrete).
                      super_TransitionObservationIndependentMADPDiscrete._m_individualMADPDs.
                      super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[id]);
  TOICompactRewardDecPOMDPDiscrete::SetIndividualRewardModel
            (this->_m_problem,decpomdp->_m_p_rModel,id);
  TOIDecPOMDPDiscrete::SetIndividualDecPOMDPD
            (&this->_m_problem->super_TOIDecPOMDPDiscrete,decpomdp,id);
  return;
}

Assistant:

void ParserTOICompactRewardDecPOMDPDiscrete::
StoreDecPOMDP(DecPOMDPDiscrete *decpomdp,
              Index id)
{
    MultiAgentDecisionProcessDiscrete* madp = 
        _m_problem->GetIndividualMADPD(id);

    decpomdp->ExtractMADPDiscrete(madp);
    _m_problem->SetIndividualRewardModel(decpomdp->GetRewardModelPtr(), id);

    _m_problem->SetIndividualDecPOMDPD(decpomdp,id);
}